

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

double __thiscall el::Logger::log(Logger *this,double __x)

{
  char *__s;
  size_t sVar1;
  ostream *in_RSI;
  double extraout_XMM0_Qa;
  double dVar2;
  
  __s = (this->m_id)._M_dataplus._M_p;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(in_RSI,__s,sVar1);
    return extraout_XMM0_Qa;
  }
  dVar2 = (double)std::ios::clear((int)in_RSI + (int)*(undefined8 *)(*(long *)in_RSI + -0x18));
  return dVar2;
}

Assistant:

virtual inline void log(el::base::type::ostream_t& os) const {
    os << m_id.c_str();
  }